

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint8_srgb2_linearalpha(float *decodep,int width_times_channels,void *inputp)

{
  byte *local_38;
  uchar *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  
  local_38 = (byte *)inputp;
  for (decode_end = decodep + 4; decode_end <= decodep + width_times_channels;
      decode_end = decode_end + 4) {
    decode_end[-4] = stbir__srgb_uchar_to_linear_float[*local_38];
    decode_end[-3] = (float)local_38[1] * 0.003921569;
    decode_end[-2] = stbir__srgb_uchar_to_linear_float[local_38[2]];
    decode_end[-1] = (float)local_38[3] * 0.003921569;
    local_38 = local_38 + 4;
  }
  if (decode_end + -4 < decodep + width_times_channels) {
    decode_end[-4] = stbir__srgb_uchar_to_linear_float[0];
    decode_end[-3] = (float)local_38[1] * 0.003921569;
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb2_linearalpha)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;
  decode += 4;
  while( decode <= decode_end )
  {
    decode[0-4] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order0] ];
    decode[1-4] = ( (float) input[stbir__decode_order1] ) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order0+2] ];
    decode[3-4] = ( (float) input[stbir__decode_order1+2] ) * stbir__max_uint8_as_float_inverted;
    input += 4;
    decode += 4;
  }
  decode -= 4;
  if( decode < decode_end )
  {
    decode[0] = stbir__srgb_uchar_to_linear_float[ stbir__decode_order0 ];
    decode[1] = ( (float) input[stbir__decode_order1] ) * stbir__max_uint8_as_float_inverted;
  }
}